

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeHMS(DateTime *p)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (p->validHMS != '\0') {
    return;
  }
  computeJD(p);
  uVar3 = (p->iJD + 43200000) % 86400000;
  uVar2 = (int)uVar3 >> 0x1f;
  uVar1 = (ulong)uVar2 << 0x20 | uVar3 & 0xffffffff;
  p->s = (double)(int)((long)uVar1 % 60000) / 1000.0;
  p->m = (int)(short)((short)((long)uVar1 / 60000) % 0x3c);
  p->h = (int)((long)((ulong)uVar2 << 0x20 | uVar3 & 0xffffffff) / 3600000);
  p->field_0x2c = p->field_0x2c & 0xfe;
  p->validHMS = '\x01';
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int day_ms, day_min; /* milliseconds, minutes into the day */
  if( p->validHMS ) return;
  computeJD(p);
  day_ms = (int)((p->iJD + 43200000) % 86400000);
  p->s = (day_ms % 60000)/1000.0;
  day_min = day_ms/60000;
  p->m = day_min % 60;
  p->h = day_min / 60;
  p->rawS = 0;
  p->validHMS = 1;
}